

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O0

double __thiscall
HighsLinearSumBounds::getResidualSumLower
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  const_reference pvVar1;
  double *pdVar2;
  const_reference pvVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double vUpper_1;
  double vLower_1;
  double vUpper;
  double vLower;
  double in_stack_ffffffffffffff58;
  HighsCDouble *in_stack_ffffffffffffff60;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  HighsCDouble local_50;
  double local_40;
  HighsCDouble local_38;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  double local_8;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_EDX;
  local_14 = in_ESI;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x90),(long)in_ESI);
  if (*pvVar1 == 0) {
    if (local_20 <= 0.0) {
      if (*(int *)(*(long *)(in_RDI + 0xe8) + (long)local_18 * 4) == local_14) {
        local_80 = *(double *)(*(long *)(in_RDI + 200) + (long)local_18 * 8);
      }
      else {
        pdVar2 = std::min<double>((double *)(*(long *)(in_RDI + 0xd8) + (long)local_18 * 8),
                                  (double *)(*(long *)(in_RDI + 200) + (long)local_18 * 8));
        local_80 = *pdVar2;
      }
      local_40 = local_80;
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x60),
                 (long)local_14);
      local_50 = HighsCDouble::operator-(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_8 = HighsCDouble::operator_cast_to_double(&local_50);
    }
    else {
      if (*(int *)(*(long *)(in_RDI + 0xe0) + (long)local_18 * 4) == local_14) {
        local_78 = *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_18 * 8);
      }
      else {
        pdVar2 = std::max<double>((double *)(*(long *)(in_RDI + 0xd0) + (long)local_18 * 8),
                                  (double *)(*(long *)(in_RDI + 0xc0) + (long)local_18 * 8));
        local_78 = *pdVar2;
      }
      local_28 = local_78;
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x60),
                 (long)local_14);
      local_38 = HighsCDouble::operator-(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_8 = HighsCDouble::operator_cast_to_double(&local_38);
    }
  }
  else if (*pvVar1 == 1) {
    if (local_20 <= 0.0) {
      if (*(int *)(*(long *)(in_RDI + 0xe8) + (long)local_18 * 4) == local_14) {
        local_98 = *(double *)(*(long *)(in_RDI + 200) + (long)local_18 * 8);
      }
      else {
        pdVar2 = std::min<double>((double *)(*(long *)(in_RDI + 0xd8) + (long)local_18 * 8),
                                  (double *)(*(long *)(in_RDI + 200) + (long)local_18 * 8));
        local_98 = *pdVar2;
      }
      if ((local_98 != INFINITY) || (NAN(local_98))) {
        local_8 = -INFINITY;
      }
      else {
        pvVar3 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                           ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x60),
                            (long)local_14);
        local_8 = HighsCDouble::operator_cast_to_double(pvVar3);
      }
    }
    else {
      if (*(int *)(*(long *)(in_RDI + 0xe0) + (long)local_18 * 4) == local_14) {
        local_88 = *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_18 * 8);
      }
      else {
        pdVar2 = std::max<double>((double *)(*(long *)(in_RDI + 0xd0) + (long)local_18 * 8),
                                  (double *)(*(long *)(in_RDI + 0xc0) + (long)local_18 * 8));
        local_88 = *pdVar2;
      }
      if ((local_88 != -INFINITY) || (NAN(local_88))) {
        local_90 = -INFINITY;
      }
      else {
        pvVar3 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                           ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x60),
                            (long)local_14);
        local_90 = HighsCDouble::operator_cast_to_double(pvVar3);
      }
      local_8 = local_90;
    }
  }
  else {
    local_8 = -INFINITY;
  }
  return local_8;
}

Assistant:

double HighsLinearSumBounds::getResidualSumLower(HighsInt sum, HighsInt var,
                                                 double coefficient) const {
  switch (numInfSumLower[sum]) {
    case 0:
      if (coefficient > 0) {
        double vLower = implVarLowerSource[var] == sum
                            ? varLower[var]
                            : std::max(implVarLower[var], varLower[var]);
        return double(sumLower[sum] - vLower * coefficient);
      } else {
        double vUpper = implVarUpperSource[var] == sum
                            ? varUpper[var]
                            : std::min(implVarUpper[var], varUpper[var]);
        return double(sumLower[sum] - vUpper * coefficient);
      }
      break;
    case 1:
      if (coefficient > 0) {
        double vLower = implVarLowerSource[var] == sum
                            ? varLower[var]
                            : std::max(implVarLower[var], varLower[var]);
        return vLower == -kHighsInf ? double(sumLower[sum]) : -kHighsInf;
      } else {
        double vUpper = implVarUpperSource[var] == sum
                            ? varUpper[var]
                            : std::min(implVarUpper[var], varUpper[var]);
        return vUpper == kHighsInf ? double(sumLower[sum]) : -kHighsInf;
      }
      break;
    default:
      return -kHighsInf;
  }
}